

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::init
          (ComputeShaderGeneratedSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ShaderProgram *pSVar3;
  RenderContext *pRVar4;
  ProgramSources *pPVar5;
  TestLog *pTVar6;
  TestError *pTVar7;
  allocator<char> local_3f1;
  string local_3f0;
  undefined1 local_3c9;
  string local_3c8;
  ShaderSource local_3a8;
  ProgramSources local_380;
  undefined1 local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  undefined1 local_281;
  string local_280;
  ShaderSource local_260;
  ProgramSources local_238;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160;
  undefined1 local_139;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_e0;
  ComputeShaderGeneratedSeparateCase *local_10;
  ComputeShaderGeneratedSeparateCase *this_local;
  
  local_10 = this;
  if (((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) != 0) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    local_139 = 1;
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
    glu::ProgramSources::ProgramSources(&local_e0);
    Functional::(anonymous_namespace)::ComputeShaderGeneratedSeparateCase::
    genCmdComputeSource_abi_cxx11_(&local_138,this);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_118,&local_138);
    pPVar5 = glu::ProgramSources::operator<<(&local_e0,&local_118);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar4,pPVar5);
    local_139 = 0;
    this->m_computeCmdProgram = pSVar3;
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    glu::ProgramSources::~ProgramSources(&local_e0);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    ctx = (EVP_PKEY_CTX *)this->m_computeCmdProgram;
    glu::operator<<(pTVar6,(ShaderProgram *)ctx);
    bVar1 = glu::ShaderProgram::isOk(this->m_computeCmdProgram);
    if (!bVar1) {
      local_162 = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Failed to compile command compute shader.",&local_161);
      tcu::TestError::TestError(pTVar7,&local_160);
      local_162 = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) != 0) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    local_281 = 1;
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
    glu::ProgramSources::ProgramSources(&local_238);
    Functional::(anonymous_namespace)::ComputeShaderGeneratedSeparateCase::
    genDataComputeSource_abi_cxx11_(&local_280,this);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_260,&local_280);
    pPVar5 = glu::ProgramSources::operator<<(&local_238,&local_260);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar4,pPVar5);
    local_281 = 0;
    this->m_computeDataProgram = pSVar3;
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    glu::ProgramSources::~ProgramSources(&local_238);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    ctx = (EVP_PKEY_CTX *)this->m_computeDataProgram;
    glu::operator<<(pTVar6,(ShaderProgram *)ctx);
    bVar1 = glu::ShaderProgram::isOk(this->m_computeDataProgram);
    if (!bVar1) {
      local_2aa = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"Failed to compile data compute shader.",&local_2a9);
      tcu::TestError::TestError(pTVar7,&local_2a8);
      local_2aa = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeIndices & 1U) != 0) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    local_3c9 = 1;
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
    glu::ProgramSources::ProgramSources(&local_380);
    Functional::(anonymous_namespace)::ComputeShaderGeneratedSeparateCase::
    genIndexComputeSource_abi_cxx11_(&local_3c8,this);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_3a8,&local_3c8);
    pPVar5 = glu::ProgramSources::operator<<(&local_380,&local_3a8);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar4,pPVar5);
    local_3c9 = 0;
    this->m_computeIndicesProgram = pSVar3;
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    glu::ProgramSources::~ProgramSources(&local_380);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    ctx = (EVP_PKEY_CTX *)this->m_computeIndicesProgram;
    glu::operator<<(pTVar6,(ShaderProgram *)ctx);
    bVar1 = glu::ShaderProgram::isOk(this->m_computeIndicesProgram);
    if (!bVar1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"Failed to compile data compute shader.",&local_3f1);
      tcu::TestError::TestError(pTVar7,&local_3f0);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  iVar2 = ComputeShaderGeneratedCase::init(&this->super_ComputeShaderGeneratedCase,ctx);
  return iVar2;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::init (void)
{
	// generate cmd compute shader

	if (m_computeCmd)
	{
		m_computeCmdProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genCmdComputeSource()));
		m_testCtx.getLog() << *m_computeCmdProgram;

		if (!m_computeCmdProgram->isOk())
			throw tcu::TestError("Failed to compile command compute shader.");
	}

	// generate data compute shader

	if (m_computeData)
	{
		m_computeDataProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genDataComputeSource()));
		m_testCtx.getLog() << *m_computeDataProgram;

		if (!m_computeDataProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// generate index compute shader

	if (m_computeIndices)
	{
		m_computeIndicesProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genIndexComputeSource()));
		m_testCtx.getLog() << *m_computeIndicesProgram;

		if (!m_computeIndicesProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// init parent
	ComputeShaderGeneratedCase::init();
}